

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.h
# Opt level: O0

Path * __thiscall Path::ensureTrailingSlash(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  String local_38;
  Path *local_18;
  Path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = String::isEmpty(&this->super_String);
  if ((!bVar1) && (bVar1 = String::endsWith(&this->super_String,'/',CaseSensitive), !bVar1)) {
    operator+(&local_38,&this->super_String,'/');
    Path(__return_storage_ptr__,&local_38);
    String::~String(&local_38);
    return __return_storage_ptr__;
  }
  Path(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

inline Path ensureTrailingSlash() const
    {
        if (!isEmpty() && !endsWith('/'))
            return *this + '/';
        return *this;
    }